

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.cpp
# Opt level: O2

void __thiscall
LiteScript::_Type_CALLBACK::Load
          (_Type_CALLBACK *this,istream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  long *plVar1;
  Callback *this_00;
  Memory *pMVar2;
  char cVar3;
  uint uVar4;
  uint l;
  code *pcVar5;
  offset_in_Memory_to_subr in_R8;
  Callback local_e0;
  
  Object::Reassign(object,(Type *)_type_callback,0xb0);
  Callback::Callback((Callback *)object->data,object->memory);
  this_00 = (Callback *)object->data;
  cVar3 = std::istream::get();
  if (cVar3 == '\0') {
    pMVar2 = object->memory;
    uVar4 = IStreamer::Read<unsigned_int>(stream);
    Callback::Callback(&local_e0,pMVar2,uVar4);
    Callback::operator=(this_00,&local_e0);
  }
  else {
    pMVar2 = object->memory;
    uVar4 = IStreamer::Read<unsigned_int>(stream);
    l = IStreamer::Read<unsigned_int>(stream);
    Callback::Callback(&local_e0,pMVar2,uVar4,l);
    Callback::operator=(this_00,&local_e0);
  }
  Callback::~Callback(&local_e0);
  cVar3 = std::istream::get();
  if (cVar3 == '\x01') {
    pMVar2 = object->memory;
    plVar1 = (long *)((long)(pMVar2->arr)._M_elems + in_R8);
    pcVar5 = (code *)caller;
    if ((caller & 1) != 0) {
      pcVar5 = *(code **)(*plVar1 + -1 + caller);
    }
    uVar4 = (*pcVar5)(plVar1,stream);
    Memory::GetVariable((Nullable<LiteScript::Variable> *)&local_e0,pMVar2,uVar4);
    Nullable<LiteScript::Variable>::operator=(&this_00->This,(Variable *)&local_e0);
    Nullable<LiteScript::Variable>::Nullify((Nullable<LiteScript::Variable> *)&local_e0);
  }
  cVar3 = std::istream::get();
  if (cVar3 == '\x01') {
    Namer::Load((Namer *)&local_e0,(Namer *)stream,(istream *)object->memory,(Memory *)caller,in_R8)
    ;
    Nullable<LiteScript::Namer>::operator=(&this_00->nsp,(Namer *)&local_e0);
    Namer::~Namer((Namer *)&local_e0);
  }
  return;
}

Assistant:

void LiteScript::_Type_CALLBACK::Load(std::istream &stream, Object &object, unsigned int (Memory::*caller)(std::istream&)) const {
    object.Reassign(Type::CALLBACK, sizeof(Callback));
    std::allocator<Callback> allocator;
    allocator.construct(&object.GetData<Callback>(), object.memory);
    Callback& C = object.GetData<Callback>();
    if (IStreamer::Read<unsigned char>(stream) == 0)
        C = Callback(object.memory, IStreamer::Read<unsigned int>(stream));
    else
        C = Callback(object.memory, IStreamer::Read<unsigned int>(stream), IStreamer::Read<unsigned int>(stream));
    if (IStreamer::Read<unsigned char>(stream) == 1)
        C.This = *object.memory.GetVariable((object.memory.*caller)(stream));
    if (IStreamer::Read<unsigned char>(stream) == 1)
        C.nsp = Namer::Load(stream, object.memory, caller);
}